

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns_handler.cpp
# Opt level: O0

int ot::commissioner::HandleRecord
              (sockaddr *aFrom,mdns_entry_type_t aEntry,uint16_t aType,uint16_t aRclass,
              uint32_t aTtl,void *aData,size_t aSize,size_t aOffset,size_t aLength,
              void *aBorderAgent)

{
  Address *this;
  size_t *this_00;
  bool bVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  uint uVar4;
  size_t sVar5;
  byte *pbVar6;
  unsigned_long uVar7;
  size_type sVar8;
  time_t tVar9;
  mdns_string_t *extraout_RDX;
  mdns_string_t *aString;
  mdns_string_t *aString_00;
  ByteArray *aBytes;
  ByteArray *aBytes_00;
  ByteArray *aBytes_01;
  ByteArray *aBytes_02;
  ByteArray *aBytes_03;
  ByteArray *aBytes_04;
  ByteArray *aBytes_05;
  ByteArray *aBytes_06;
  mdns_string_t *extraout_RDX_00;
  v10 *pvVar10;
  utils *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar11;
  mdns_string_t mVar12;
  basic_string_view<char> bVar13;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  char *local_2498;
  string local_2458;
  anon_class_1_0_00000001 local_2432;
  v10 local_2431;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2430;
  char *local_2428;
  string local_2420;
  Error local_2400;
  utils *local_23d8;
  ByteArray *bbrPort;
  anon_class_1_0_00000001 local_23aa;
  v10 local_23a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_23a8;
  char *local_23a0;
  string local_2398;
  Error local_2378;
  utils *local_2350;
  ByteArray *bbrSeqNum;
  anon_class_1_0_00000001 local_2322;
  v10 local_2321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2320;
  char *local_2318;
  string local_2310;
  Error local_22f0;
  utils *local_22c8;
  ByteArray *oui;
  anon_class_1_0_00000001 local_229a;
  v10 local_2299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2298;
  char *local_2290;
  string local_2288;
  Error local_2268;
  utils *local_2240;
  ByteArray *partitionId;
  string local_2230;
  anon_class_1_0_00000001 local_220a;
  v10 local_2209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2208;
  char *local_2200;
  string local_21f8;
  Error local_21d8;
  utils *local_21b0;
  ByteArray *activeTimestamp;
  anon_class_1_0_00000001 local_2182;
  v10 local_2181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2180;
  char *local_2178;
  string local_2170;
  Error local_2150;
  utils *local_2128;
  ByteArray *extendPanId;
  anon_class_1_0_00000001 local_20fa;
  v10 local_20f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20f8;
  char *local_20f0;
  string local_20e8;
  Error local_20c8;
  utils *local_20a0;
  ByteArray *bitmap;
  anon_class_1_0_00000001 local_2072;
  v10 local_2071;
  v10 *local_2070;
  char *local_2068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2060;
  Error local_2040;
  utils *local_2018;
  ByteArray *discriminator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2008;
  char *local_2000;
  string local_1ff8;
  Error local_1fd8;
  undefined1 local_1fb0 [8];
  ByteArray binaryValue;
  string value;
  string key;
  size_t i;
  size_t parsed;
  mdns_record_txt_t txtBuffer [128];
  anon_class_1_0_00000001 local_f22;
  v10 local_f21;
  v10 *local_f20;
  char *local_f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  Error local_ef0;
  undefined4 local_ec4;
  Error local_ec0;
  string local_e98 [8];
  string addrStr_1;
  sockaddr_in6 addr_1;
  sockaddr_storage addrStorage_1;
  string local_dc8;
  anon_class_1_0_00000001 local_da2;
  v10 local_da1;
  v10 *local_da0;
  char *local_d98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  Error local_d70;
  undefined4 local_d44;
  Error local_d40;
  string local_d18 [8];
  string addrStr;
  sockaddr_in addr;
  sockaddr_storage addrStorage;
  mdns_record_srv_t server;
  string local_c48 [32];
  char *local_c28;
  mdns_string_t nameStr;
  anon_class_1_0_00000001 local_bf2;
  v10 local_bf1;
  v10 *local_bf0;
  size_t local_be8;
  string local_be0;
  Error local_bc0;
  ErrorCode local_b98 [4];
  Error local_b88;
  Error *local_b60;
  Error *error;
  BorderAgent *borderAgent;
  BorderAgentOrErrorMsg *borderAgentOrErrorMsg;
  char nameBuffer [256];
  string local_a40 [8];
  string entryType;
  string fromAddrStr;
  Address fromAddr;
  sockaddr_storage fromAddrStorage;
  void *aData_local;
  uint32_t aTtl_local;
  uint16_t aRclass_local;
  uint16_t aType_local;
  mdns_entry_type_t aEntry_local;
  sockaddr *aFrom_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_938 [3];
  undefined1 local_920 [16];
  v10 *local_910;
  ulong local_908;
  v10 *local_900;
  size_t sStack_8f8;
  string *local_8f0;
  v10 *local_8e8;
  v10 **local_8e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8d8 [2];
  undefined1 local_8c8 [16];
  v10 *local_8b8;
  char *local_8b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8a8;
  v10 *local_8a0;
  char *pcStack_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_890;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_888 [2];
  undefined1 local_878 [16];
  v10 *local_868;
  char *local_860;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_858;
  v10 *local_850;
  char *pcStack_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_840;
  v10 *local_838;
  v10 **local_830;
  v10 *local_828;
  v10 **local_820;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_818;
  undefined1 local_7f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7e0;
  char *local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d0;
  pointer *local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c0;
  char *pcStack_7b8;
  string *local_7b0;
  v10 *local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_7a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_798 [2];
  undefined1 local_788 [16];
  v10 *local_778;
  char *local_770;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_768;
  v10 *local_760;
  char *pcStack_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_750;
  v10 *local_748;
  v10 **local_740;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_738;
  undefined1 local_710 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_700;
  char *local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6f0;
  string *local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6e0;
  char *pcStack_6d8;
  string *local_6d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6c8;
  undefined1 local_6a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_690;
  char *local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_680;
  v10 *local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_670;
  char *pcStack_668;
  string *local_660;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_658;
  undefined1 local_630 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_620;
  char *local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_610;
  v10 *local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_600;
  char *pcStack_5f8;
  string *local_5f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e8;
  undefined1 local_5c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b0;
  char *local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  v10 *local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_590;
  char *pcStack_588;
  string *local_580;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  undefined1 local_550 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_540;
  char *local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  string *local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  char *pcStack_518;
  string *local_510;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_508;
  undefined1 local_4e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d0;
  char *local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  v10 *local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b0;
  char *pcStack_4a8;
  string *local_4a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  undefined1 local_478 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_468;
  char *local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  v10 *local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  char *pcStack_440;
  string *local_438;
  v10 *local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_428;
  v10 *local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_418;
  v10 *local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_408;
  v10 *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_3f8;
  v10 *local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_3e8;
  v10 *local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_3d8;
  v10 *local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_3c8;
  v10 **local_3c0;
  v10 *local_3b8;
  size_t sStack_3b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_3a0;
  undefined1 *local_398;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_390;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_388;
  undefined8 local_380;
  undefined1 *local_378;
  v10 **local_370;
  v10 *local_368;
  char *pcStack_360;
  v10 **local_350;
  v10 *local_348;
  char *pcStack_340;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_330;
  undefined1 *local_328;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_320;
  undefined8 local_318;
  undefined1 *local_310;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_308;
  undefined1 *local_300;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_2f8;
  undefined8 local_2f0;
  undefined1 *local_2e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_2e0;
  undefined1 *local_2d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_2d0;
  undefined8 local_2c8;
  undefined1 *local_2c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_2b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_2b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  char *pcStack_290;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_280;
  undefined1 *local_278;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_270;
  undefined8 local_268;
  undefined1 *local_260;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_258;
  undefined1 *local_250;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_248;
  undefined8 local_240;
  undefined1 *local_238;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_230;
  undefined1 *local_228;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_220;
  undefined8 local_218;
  undefined1 *local_210;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_208;
  undefined1 *local_200;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1f8;
  undefined8 local_1f0;
  undefined1 *local_1e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e0;
  undefined1 *local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d0;
  undefined8 local_1c8;
  undefined1 *local_1c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b8;
  undefined1 *local_1b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1a8;
  undefined8 local_1a0;
  undefined1 *local_198;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_190;
  undefined1 *local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_180;
  undefined8 local_178;
  undefined1 *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_168;
  undefined1 *local_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_158;
  undefined8 local_150;
  undefined1 *local_148;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_118;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_108;
  v10 **local_100;
  v10 *local_f8;
  char *pcStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  char *pcStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  char *pcStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  char *pcStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  char *pcStack_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  char *pcStack_10;
  
  this = (Address *)((long)&fromAddrStr.field_2 + 8);
  aVar11 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )aData;
  Address::Address(this);
  std::__cxx11::string::string((string *)(entryType.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_a40);
  borderAgent = (BorderAgent *)aBorderAgent;
  error = (Error *)aBorderAgent;
  local_b60 = (Error *)((long)aBorderAgent + 0x178);
  fromAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)aFrom;
  Address::Set(&local_b88,this,
               (sockaddr_storage *)
               &fromAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b98[0] = kNone;
  bVar1 = operator!=(&local_b88,local_b98);
  Error::~Error(&local_b88);
  if (bVar1) {
    HandleRecord::anon_class_1_0_00000001::operator()(&local_bf2);
    local_8e0 = &local_bf0;
    local_8e8 = &local_bf1;
    bVar13 = ::fmt::v10::operator()(local_8e8);
    local_be8 = bVar13.size_;
    local_bf0 = (v10 *)bVar13.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_8f0 = &local_be0;
    local_900 = local_bf0;
    sStack_8f8 = local_be8;
    local_3c0 = &local_900;
    local_910 = local_bf0;
    local_908 = local_be8;
    local_3b8 = local_910;
    sStack_3b0 = local_908;
    local_938[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_398 = local_920;
    local_3a0 = local_938;
    local_380 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_908;
    args.field_1.values_ = aVar11.values_;
    args.desc_ = (unsigned_long_long)local_3a0;
    local_390 = local_3a0;
    local_388 = local_3a0;
    local_378 = local_398;
    ::fmt::v10::vformat_abi_cxx11_(&local_be0,local_910,fmt,args);
    Error::Error(&local_bc0,kBadFormat,&local_be0);
    Error::operator=(local_b60,&local_bc0);
    Error::~Error(&local_bc0);
    std::__cxx11::string::~string((string *)&local_be0);
  }
  else {
    Address::ToString_abi_cxx11_
              ((string *)&nameStr.length,(Address *)((long)&fromAddrStr.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(entryType.field_2._M_local_buf + 8),(string *)&nameStr.length);
    std::__cxx11::string::~string((string *)&nameStr.length);
    if (aEntry == MDNS_ENTRYTYPE_ANSWER) {
      local_2498 = "answer";
    }
    else {
      local_2498 = "additional";
      if (aEntry == MDNS_ENTRYTYPE_AUTHORITY) {
        local_2498 = "authority";
      }
    }
    std::__cxx11::string::operator=(local_a40,local_2498);
    if (aType == 0xc) {
      mVar12 = mdns_record_parse_ptr
                         (aData,aSize,aOffset,aLength,(char *)&borderAgentOrErrorMsg,0x100);
      local_c28 = mVar12.str;
      nameStr.str = (char *)mVar12.length;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c48,mVar12.str,(ulong)mVar12.length,
                 (allocator *)((long)&server.name.length + 7));
      std::__cxx11::string::operator=((string *)&error[8].mMessage,local_c48);
      std::__cxx11::string::~string(local_c48);
      std::allocator<char>::~allocator((allocator<char> *)((long)&server.name.length + 7));
      *(undefined4 *)&error[9].mMessage = 0x10000;
    }
    else if (aType == 0x21) {
      mdns_record_parse_srv
                ((mdns_record_srv_t *)&addrStorage.__ss_align,aData,aSize,aOffset,aLength,
                 (char *)&borderAgentOrErrorMsg,0x100);
      *(undefined2 *)&error[1].mCode = addrStorage.__ss_align._4_2_;
      *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 2;
    }
    else if (aType == 1) {
      std::__cxx11::string::string(local_d18);
      mdns_record_parse_a(aData,aSize,aOffset,aLength,(sockaddr_in *)((long)&addrStr.field_2 + 8));
      addr.sin_zero[0] = addrStr.field_2._8_1_;
      addr.sin_zero[1] = addrStr.field_2._9_1_;
      addr.sin_zero[2] = addrStr.field_2._10_1_;
      addr.sin_zero[3] = addrStr.field_2._11_1_;
      addr.sin_zero[4] = addrStr.field_2._12_1_;
      addr.sin_zero[5] = addrStr.field_2._13_1_;
      addr.sin_zero[6] = addrStr.field_2._14_1_;
      addr.sin_zero[7] = addrStr.field_2._15_1_;
      addrStorage._0_8_ = addr._0_8_;
      Address::Set(&local_d40,(Address *)((long)&fromAddrStr.field_2 + 8),
                   (sockaddr_storage *)addr.sin_zero);
      local_d44 = 0;
      pvVar10 = (v10 *)&local_d44;
      bVar1 = operator!=(&local_d40,(ErrorCode *)pvVar10);
      Error::~Error(&local_d40);
      if (bVar1) {
        HandleRecord::anon_class_1_0_00000001::operator()(&local_da2);
        local_830 = &local_da0;
        local_838 = &local_da1;
        bVar13 = ::fmt::v10::operator()(local_838);
        local_d98 = (char *)bVar13.size_;
        local_da0 = (v10 *)bVar13.data_;
        ::fmt::v10::detail::
        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_840 = &local_d90;
        local_850 = local_da0;
        pcStack_848 = local_d98;
        local_858 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&entryType.field_2 + 8);
        local_370 = &local_850;
        local_868 = local_da0;
        local_860 = local_d98;
        local_368 = local_868;
        pcStack_360 = local_860;
        local_888[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                 (local_858,pvVar10,local_840);
        local_300 = local_878;
        local_308 = local_888;
        local_2f0 = 0xd;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_860;
        args_00.field_1.values_ = aVar11.values_;
        args_00.desc_ = (unsigned_long_long)local_308;
        local_2f8 = local_308;
        local_2e8 = local_300;
        local_2b0 = local_308;
        ::fmt::v10::vformat_abi_cxx11_(&local_d90,local_868,fmt_00,args_00);
        Error::Error(&local_d70,kBadFormat,&local_d90);
        Error::operator=(local_b60,&local_d70);
        Error::~Error(&local_d70);
        std::__cxx11::string::~string((string *)&local_d90);
        bVar1 = true;
      }
      else {
        Address::ToString_abi_cxx11_(&local_dc8,(Address *)((long)&fromAddrStr.field_2 + 8));
        std::__cxx11::string::operator=(local_d18,(string *)&local_dc8);
        std::__cxx11::string::~string((string *)&local_dc8);
        if (((undefined1  [32])error[9].mMessage & (undefined1  [32])0x1) == (undefined1  [32])0x0)
        {
          std::__cxx11::string::operator=((string *)&error->mMessage,local_d18);
          *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 1;
        }
        bVar1 = false;
      }
      std::__cxx11::string::~string(local_d18);
      if (bVar1) {
joined_r0x002e332d:
        if (!bVar1) goto LAB_002e33df;
        goto LAB_002e33cb;
      }
    }
    else if (aType == 0x1c) {
      std::__cxx11::string::string(local_e98);
      mdns_record_parse_aaaa
                (aData,aSize,aOffset,aLength,(sockaddr_in6 *)((long)&addrStr_1.field_2 + 0xc));
      addr_1._20_8_ = stack0xfffffffffffff18c;
      Address::Set(&local_ec0,(Address *)((long)&fromAddrStr.field_2 + 8),
                   (sockaddr_storage *)((long)&addr_1.sin6_addr.__in6_u + 0xc));
      local_ec4 = 0;
      pvVar10 = (v10 *)&local_ec4;
      bVar1 = operator!=(&local_ec0,(ErrorCode *)pvVar10);
      Error::~Error(&local_ec0);
      if (bVar1) {
        HandleRecord::anon_class_1_0_00000001::operator()(&local_f22);
        local_820 = &local_f20;
        local_828 = &local_f21;
        bVar13 = ::fmt::v10::operator()(local_828);
        local_f18 = (char *)bVar13.size_;
        local_f20 = (v10 *)bVar13.data_;
        ::fmt::v10::detail::
        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_890 = &local_f10;
        local_8a0 = local_f20;
        pcStack_898 = local_f18;
        local_8a8 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&entryType.field_2 + 8);
        local_350 = &local_8a0;
        local_8b8 = local_f20;
        local_8b0 = local_f18;
        local_348 = local_8b8;
        pcStack_340 = local_8b0;
        local_8d8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                 (local_8a8,pvVar10,local_890);
        local_2d8 = local_8c8;
        local_2e0 = local_8d8;
        local_2c8 = 0xd;
        fmt_01.size_ = 0xd;
        fmt_01.data_ = local_8b0;
        args_01.field_1.values_ = aVar11.values_;
        args_01.desc_ = (unsigned_long_long)local_2e0;
        local_2d0 = local_2e0;
        local_2c0 = local_2d8;
        local_2b8 = local_2e0;
        ::fmt::v10::vformat_abi_cxx11_(&local_f10,local_8b8,fmt_01,args_01);
        Error::Error(&local_ef0,kBadFormat,&local_f10);
        Error::operator=(local_b60,&local_ef0);
        Error::~Error(&local_ef0);
        std::__cxx11::string::~string((string *)&local_f10);
      }
      else {
        Address::ToString_abi_cxx11_
                  ((string *)&txtBuffer[0x7f].value.length,
                   (Address *)((long)&fromAddrStr.field_2 + 8));
        this_00 = &txtBuffer[0x7f].value.length;
        std::__cxx11::string::operator=(local_e98,(string *)this_00);
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::operator=((string *)&error->mMessage,local_e98);
        *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 1;
      }
      std::__cxx11::string::~string(local_e98);
      if (bVar1) goto joined_r0x002e332d;
    }
    else if (aType == 0x10) {
      aVar11 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )0x80;
      sVar5 = mdns_record_parse_txt(aData,aSize,aOffset,aLength,(mdns_record_txt_t *)&parsed,0x80);
      aString = extraout_RDX;
      for (key.field_2._8_8_ = 0; (ulong)key.field_2._8_8_ < sVar5;
          key.field_2._8_8_ = key.field_2._8_8_ + 1) {
        ToString_abi_cxx11_((string *)((long)&value.field_2 + 8),
                            (commissioner *)&txtBuffer[key.field_2._8_8_ + -1].value.length,aString)
        ;
        ToString_abi_cxx11_((string *)
                            &binaryValue.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (commissioner *)&txtBuffer[key.field_2._8_8_].key.length,aString_00);
        ToByteArray((ByteArray *)local_1fb0,
                    (mdns_string_t *)&txtBuffer[key.field_2._8_8_].key.length);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&value.field_2 + 8),"rv");
        if (bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&binaryValue.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"1");
          if (bVar1) goto LAB_002e32e4;
          HandleRecord::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&discriminator + 6));
          local_7a0 = &local_2008;
          local_7a8 = (v10 *)((long)&discriminator + 7);
          bVar13 = ::fmt::v10::operator()(local_7a8);
          local_2000 = (char *)bVar13.size_;
          local_2008 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       bVar13.data_;
          ::fmt::v10::detail::
          check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          local_7b0 = &local_1ff8;
          local_7c0 = local_2008;
          pcStack_7b8 = local_2000;
          local_7c8 = &binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_7d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&entryType.field_2 + 8);
          local_2a0 = &local_7c0;
          local_7e0 = local_2008;
          local_7d8 = local_2000;
          local_298 = local_7e0;
          pcStack_290 = local_7d8;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                    (&local_818,(v10 *)local_7c8,local_7d0,local_2008);
          local_160 = local_7f0;
          local_168 = &local_818;
          local_150 = 0xdd;
          fmt_02.size_ = 0xdd;
          fmt_02.data_ = local_7d8;
          args_02.field_1.values_ = aVar11.values_;
          args_02.desc_ = (unsigned_long_long)local_168;
          local_158 = local_168;
          local_148 = local_160;
          local_140 = local_168;
          ::fmt::v10::vformat_abi_cxx11_(&local_1ff8,(v10 *)local_7e0,fmt_02,args_02);
          Error::Error(&local_1fd8,kBadFormat,&local_1ff8);
          Error::operator=(local_b60,&local_1fd8);
          Error::~Error(&local_1fd8);
          std::__cxx11::string::~string((string *)&local_1ff8);
          bVar1 = true;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&value.field_2 + 8),"dd");
          if (bVar1) {
            local_2018 = (utils *)local_1fb0;
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2018);
            if (sVar8 != 8) {
              HandleRecord::anon_class_1_0_00000001::operator()(&local_2072);
              local_740 = &local_2070;
              local_748 = &local_2071;
              bVar13 = ::fmt::v10::operator()(local_748);
              local_2068 = (char *)bVar13.size_;
              local_2070 = (v10 *)bVar13.data_;
              ::fmt::v10::detail::
              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                        ();
              this_01 = local_2018;
              utils::Hex_abi_cxx11_((string *)&bitmap,local_2018,aBytes);
              local_750 = &local_2060;
              local_760 = local_2070;
              pcStack_758 = local_2068;
              local_768 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&bitmap;
              local_100 = &local_760;
              local_778 = local_2070;
              local_770 = local_2068;
              local_f8 = local_778;
              pcStack_f0 = local_770;
              local_798[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                       (local_768,(v10 *)this_01,local_750);
              local_328 = local_788;
              local_330 = local_798;
              local_318 = 0xd;
              fmt_03.size_ = 0xd;
              fmt_03.data_ = local_770;
              args_03.field_1.values_ = aVar11.values_;
              args_03.desc_ = (unsigned_long_long)local_330;
              local_320 = local_330;
              local_310 = local_328;
              local_2a8 = local_330;
              ::fmt::v10::vformat_abi_cxx11_(&local_2060,local_778,fmt_03,args_03);
              Error::Error(&local_2040,kBadFormat,&local_2060);
              Error::operator=(local_b60,&local_2040);
              Error::~Error(&local_2040);
              std::__cxx11::string::~string((string *)&local_2060);
              std::__cxx11::string::~string((string *)&bitmap);
              bVar1 = true;
              goto LAB_002e32ee;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&error[1].mMessage,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2018);
            *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x8000;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&value.field_2 + 8),"tv");
            if (bVar1) {
              std::__cxx11::string::operator=
                        ((string *)(error[1].mMessage.field_2._M_local_buf + 8),
                         (string *)
                         &binaryValue.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&value.field_2 + 8),"sb");
              if (bVar1) {
                local_20a0 = (utils *)local_1fb0;
                sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_20a0);
                if (sVar8 != 4) {
                  HandleRecord::anon_class_1_0_00000001::operator()(&local_20fa);
                  local_428 = &local_20f8;
                  local_430 = &local_20f9;
                  bVar13 = ::fmt::v10::operator()(local_430);
                  local_20f0 = (char *)bVar13.size_;
                  local_20f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               bVar13.data_;
                  ::fmt::v10::detail::
                  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                            ();
                  utils::Hex_abi_cxx11_((string *)&extendPanId,local_20a0,aBytes_00);
                  local_438 = &local_20e8;
                  local_448 = local_20f8;
                  pcStack_440 = local_20f0;
                  local_450 = (v10 *)&extendPanId;
                  local_458 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&entryType.field_2 + 8);
                  local_e0 = &local_448;
                  local_468 = local_20f8;
                  local_460 = local_20f0;
                  local_d8 = local_468;
                  pcStack_d0 = local_460;
                  ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                            (&local_498,local_450,local_458,local_20f8);
                  local_278 = local_478;
                  local_280 = &local_498;
                  local_268 = 0xdd;
                  fmt_04.size_ = 0xdd;
                  fmt_04.data_ = local_460;
                  args_04.field_1.values_ = aVar11.values_;
                  args_04.desc_ = (unsigned_long_long)local_280;
                  local_270 = local_280;
                  local_260 = local_278;
                  local_108 = local_280;
                  ::fmt::v10::vformat_abi_cxx11_(&local_20e8,(v10 *)local_468,fmt_04,args_04);
                  Error::Error(&local_20c8,kBadFormat,&local_20e8);
                  Error::operator=(local_b60,&local_20c8);
                  Error::~Error(&local_20c8);
                  std::__cxx11::string::~string((string *)&local_20e8);
                  std::__cxx11::string::~string((string *)&extendPanId);
                  bVar1 = true;
                  goto LAB_002e32ee;
                }
                pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_20a0,3);
                *(ushort *)&error[2].mMessage.field_2 =
                     *(ushort *)&error[2].mMessage.field_2 & 0xfff8 | *pbVar6 & 7;
                pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_20a0,3);
                *(ushort *)&error[2].mMessage.field_2 =
                     *(ushort *)&error[2].mMessage.field_2 & 0xffe7 |
                     (short)((int)(*pbVar6 & 0x18) >> 3) << 3;
                pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_20a0,3);
                *(ushort *)&error[2].mMessage.field_2 =
                     *(ushort *)&error[2].mMessage.field_2 & 0xff9f |
                     (short)((int)(*pbVar6 & 0x60) >> 5) << 5;
                pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_20a0,3);
                *(ushort *)&error[2].mMessage.field_2 =
                     *(ushort *)&error[2].mMessage.field_2 & 0xff7f |
                     (short)((int)(*pbVar6 & 0x80) >> 7) << 7;
                pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_20a0,2);
                *(ushort *)&error[2].mMessage.field_2 =
                     *(ushort *)&error[2].mMessage.field_2 & 0xfeff | (*pbVar6 & 1) << 8;
                *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 8;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&value.field_2 + 8),"nn");
                if (bVar1) {
                  std::__cxx11::string::operator=
                            ((string *)(error[2].mMessage.field_2._M_local_buf + 8),
                             (string *)
                             &binaryValue.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
                  *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x10;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&value.field_2 + 8),"xp");
                  if (bVar1) {
                    local_2128 = (utils *)local_1fb0;
                    sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_2128);
                    if (sVar8 != 8) {
                      HandleRecord::anon_class_1_0_00000001::operator()(&local_2182);
                      local_418 = &local_2180;
                      local_420 = &local_2181;
                      bVar13 = ::fmt::v10::operator()(local_420);
                      local_2178 = (char *)bVar13.size_;
                      local_2180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)bVar13.data_;
                      ::fmt::v10::detail::
                      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                ();
                      utils::Hex_abi_cxx11_((string *)&activeTimestamp,local_2128,aBytes_01);
                      local_4a0 = &local_2170;
                      local_4b0 = local_2180;
                      pcStack_4a8 = local_2178;
                      local_4b8 = (v10 *)&activeTimestamp;
                      local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&entryType.field_2 + 8);
                      local_c0 = &local_4b0;
                      local_4d0 = local_2180;
                      local_4c8 = local_2178;
                      local_b8 = local_4d0;
                      pcStack_b0 = local_4c8;
                      ::fmt::v10::
                      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                                (&local_508,local_4b8,local_4c0,local_2180);
                      local_250 = local_4e0;
                      local_258 = &local_508;
                      local_240 = 0xdd;
                      fmt_05.size_ = 0xdd;
                      fmt_05.data_ = local_4c8;
                      args_05.field_1.values_ = aVar11.values_;
                      args_05.desc_ = (unsigned_long_long)local_258;
                      local_248 = local_258;
                      local_238 = local_250;
                      local_110 = local_258;
                      ::fmt::v10::vformat_abi_cxx11_(&local_2170,(v10 *)local_4d0,fmt_05,args_05);
                      Error::Error(&local_2150,kBadFormat,&local_2170);
                      Error::operator=(local_b60,&local_2150);
                      Error::~Error(&local_2150);
                      std::__cxx11::string::~string((string *)&local_2170);
                      std::__cxx11::string::~string((string *)&activeTimestamp);
                      bVar1 = true;
                      goto LAB_002e32ee;
                    }
                    uVar7 = utils::Decode<unsigned_long>((ByteArray *)local_2128);
                    error[3].mMessage.field_2._M_allocated_capacity = uVar7;
                    *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x20;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&value.field_2 + 8),"vn");
                    if (bVar1) {
                      std::__cxx11::string::operator=
                                ((string *)(error[3].mMessage.field_2._M_local_buf + 8),
                                 (string *)
                                 &binaryValue.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
                      *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x40;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&value.field_2 + 8),"mn");
                      if (bVar1) {
                        std::__cxx11::string::operator=
                                  ((string *)error[4].mMessage.field_2._M_local_buf,
                                   (string *)
                                   &binaryValue.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x80;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)&value.field_2 + 8),"at");
                        if (bVar1) {
                          local_21b0 = (utils *)local_1fb0;
                          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)local_21b0);
                          if (sVar8 != 8) {
                            HandleRecord::anon_class_1_0_00000001::operator()(&local_220a);
                            local_408 = &local_2208;
                            local_410 = &local_2209;
                            bVar13 = ::fmt::v10::operator()(local_410);
                            local_2200 = (char *)bVar13.size_;
                            local_2208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)bVar13.data_;
                            ::fmt::v10::detail::
                            check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                      ();
                            utils::Hex_abi_cxx11_(&local_2230,local_21b0,aBytes_02);
                            local_510 = &local_21f8;
                            local_520 = local_2208;
                            pcStack_518 = local_2200;
                            local_528 = &local_2230;
                            local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&entryType.field_2 + 8);
                            local_a0 = &local_520;
                            local_540 = local_2208;
                            local_538 = local_2200;
                            local_98 = local_540;
                            pcStack_90 = local_538;
                            ::fmt::v10::
                            make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                                      (&local_578,(v10 *)local_528,local_530,local_2208);
                            local_228 = local_550;
                            local_230 = &local_578;
                            local_218 = 0xdd;
                            fmt_06.size_ = 0xdd;
                            fmt_06.data_ = local_538;
                            args_06.field_1.values_ = aVar11.values_;
                            args_06.desc_ = (unsigned_long_long)local_230;
                            local_220 = local_230;
                            local_210 = local_228;
                            local_118 = local_230;
                            ::fmt::v10::vformat_abi_cxx11_
                                      (&local_21f8,(v10 *)local_540,fmt_06,args_06);
                            Error::Error(&local_21d8,kBadFormat,&local_21f8);
                            Error::operator=(local_b60,&local_21d8);
                            Error::~Error(&local_21d8);
                            std::__cxx11::string::~string((string *)&local_21f8);
                            std::__cxx11::string::~string((string *)&local_2230);
                            bVar1 = true;
                            goto LAB_002e32ee;
                          }
                          uVar7 = utils::Decode<unsigned_long>((ByteArray *)local_21b0);
                          partitionId = (ByteArray *)Timestamp::Decode(uVar7);
                          error[5].mMessage._M_string_length = (size_type)partitionId;
                          *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x100;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&value.field_2 + 8),"pt");
                          if (bVar1) {
                            local_2240 = (utils *)local_1fb0;
                            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)local_2240);
                            if (sVar8 != 4) {
                              HandleRecord::anon_class_1_0_00000001::operator()(&local_229a);
                              local_3f8 = &local_2298;
                              local_400 = &local_2299;
                              bVar13 = ::fmt::v10::operator()(local_400);
                              local_2290 = (char *)bVar13.size_;
                              local_2298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)bVar13.data_;
                              ::fmt::v10::detail::
                              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                        ();
                              utils::Hex_abi_cxx11_((string *)&oui,local_2240,aBytes_03);
                              local_580 = &local_2288;
                              local_590 = local_2298;
                              pcStack_588 = local_2290;
                              local_598 = (v10 *)&oui;
                              local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&entryType.field_2 + 8);
                              local_80 = &local_590;
                              local_5b0 = local_2298;
                              local_5a8 = local_2290;
                              local_78 = local_5b0;
                              pcStack_70 = local_5a8;
                              ::fmt::v10::
                              make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                                        (&local_5e8,local_598,local_5a0,local_2298);
                              local_200 = local_5c0;
                              local_208 = &local_5e8;
                              local_1f0 = 0xdd;
                              fmt_07.size_ = 0xdd;
                              fmt_07.data_ = local_5a8;
                              args_07.field_1.values_ = aVar11.values_;
                              args_07.desc_ = (unsigned_long_long)local_208;
                              local_1f8 = local_208;
                              local_1e8 = local_200;
                              local_120 = local_208;
                              ::fmt::v10::vformat_abi_cxx11_
                                        (&local_2288,(v10 *)local_5b0,fmt_07,args_07);
                              Error::Error(&local_2268,kBadFormat,&local_2288);
                              Error::operator=(local_b60,&local_2268);
                              Error::~Error(&local_2268);
                              std::__cxx11::string::~string((string *)&local_2288);
                              std::__cxx11::string::~string((string *)&oui);
                              bVar1 = true;
                              goto LAB_002e32ee;
                            }
                            uVar4 = utils::Decode<unsigned_int>((ByteArray *)local_2240);
                            *(uint *)&error[5].mMessage.field_2 = uVar4;
                            *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x200;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&value.field_2 + 8),"vd");
                            if (bVar1) {
                              std::__cxx11::string::operator=
                                        ((string *)(error[5].mMessage.field_2._M_local_buf + 8),
                                         (string *)
                                         &binaryValue.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x400;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&value.field_2 + 8),"vo");
                              if (bVar1) {
                                local_22c8 = (utils *)local_1fb0;
                                sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                        size((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)local_22c8);
                                if (sVar8 != 3) {
                                  HandleRecord::anon_class_1_0_00000001::operator()(&local_2322);
                                  local_3e8 = &local_2320;
                                  local_3f0 = &local_2321;
                                  bVar13 = ::fmt::v10::operator()(local_3f0);
                                  local_2318 = (char *)bVar13.size_;
                                  local_2320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)bVar13.data_;
                                  ::fmt::v10::detail::
                                  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                            ();
                                  utils::Hex_abi_cxx11_((string *)&bbrSeqNum,local_22c8,aBytes_04);
                                  local_5f0 = &local_2310;
                                  local_600 = local_2320;
                                  pcStack_5f8 = local_2318;
                                  local_608 = (v10 *)&bbrSeqNum;
                                  local_610 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&entryType.field_2 + 8);
                                  local_60 = &local_600;
                                  local_620 = local_2320;
                                  local_618 = local_2318;
                                  local_58 = local_620;
                                  pcStack_50 = local_618;
                                  ::fmt::v10::
                                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                                            (&local_658,local_608,local_610,local_2320);
                                  local_1d8 = local_630;
                                  local_1e0 = &local_658;
                                  local_1c8 = 0xdd;
                                  fmt_08.size_ = 0xdd;
                                  fmt_08.data_ = local_618;
                                  args_08.field_1.values_ = aVar11.values_;
                                  args_08.desc_ = (unsigned_long_long)local_1e0;
                                  local_1d0 = local_1e0;
                                  local_1c0 = local_1d8;
                                  local_128 = local_1e0;
                                  ::fmt::v10::vformat_abi_cxx11_
                                            (&local_2310,(v10 *)local_620,fmt_08,args_08);
                                  Error::Error(&local_22f0,kBadFormat,&local_2310);
                                  Error::operator=(local_b60,&local_22f0);
                                  Error::~Error(&local_22f0);
                                  std::__cxx11::string::~string((string *)&local_2310);
                                  std::__cxx11::string::~string((string *)&bbrSeqNum);
                                  bVar1 = true;
                                  goto LAB_002e32ee;
                                }
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                operator=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &error[6].mMessage.field_2,
                                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          local_22c8);
                                *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x800;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&value.field_2 + 8),"dn");
                                if (bVar1) {
                                  std::__cxx11::string::operator=
                                            ((string *)&error[7].mMessage,
                                             (string *)
                                             &binaryValue.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                                  *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x1000
                                  ;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&value.field_2 + 8),"sq");
                                  if (bVar1) {
                                    local_2350 = (utils *)local_1fb0;
                                    sVar8 = std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            size((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)local_2350);
                                    if (sVar8 != 1) {
                                      HandleRecord::anon_class_1_0_00000001::operator()(&local_23aa)
                                      ;
                                      local_3d8 = &local_23a8;
                                      local_3e0 = &local_23a9;
                                      bVar13 = ::fmt::v10::operator()(local_3e0);
                                      local_23a0 = (char *)bVar13.size_;
                                      local_23a8 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)bVar13.data_;
                                      ::fmt::v10::detail::
                                      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                                ();
                                      utils::Hex_abi_cxx11_((string *)&bbrPort,local_2350,aBytes_05)
                                      ;
                                      local_660 = &local_2398;
                                      local_670 = local_23a8;
                                      pcStack_668 = local_23a0;
                                      local_678 = (v10 *)&bbrPort;
                                      local_680 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&entryType.field_2 + 8);
                                      local_40 = &local_670;
                                      local_690 = local_23a8;
                                      local_688 = local_23a0;
                                      local_38 = local_690;
                                      pcStack_30 = local_688;
                                      ::fmt::v10::
                                      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                                                (&local_6c8,local_678,local_680,local_23a8);
                                      local_1b0 = local_6a0;
                                      local_1b8 = &local_6c8;
                                      local_1a0 = 0xdd;
                                      fmt_09.size_ = 0xdd;
                                      fmt_09.data_ = local_688;
                                      args_09.field_1.values_ = aVar11.values_;
                                      args_09.desc_ = (unsigned_long_long)local_1b8;
                                      local_1a8 = local_1b8;
                                      local_198 = local_1b0;
                                      local_130 = local_1b8;
                                      ::fmt::v10::vformat_abi_cxx11_
                                                (&local_2398,(v10 *)local_690,fmt_09,args_09);
                                      Error::Error(&local_2378,kBadFormat,&local_2398);
                                      Error::operator=(local_b60,&local_2378);
                                      Error::~Error(&local_2378);
                                      std::__cxx11::string::~string((string *)&local_2398);
                                      std::__cxx11::string::~string((string *)&bbrPort);
                                      bVar1 = true;
                                      goto LAB_002e32ee;
                                    }
                                    uVar2 = utils::Decode<unsigned_char>((ByteArray *)local_2350);
                                    *(undefined1 *)&error[8].mCode = uVar2;
                                    *(uint *)&error[9].mMessage =
                                         *(uint *)&error[9].mMessage | 0x2000;
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&value.field_2 + 8),"bb");
                                    if (bVar1) {
                                      local_23d8 = (utils *)local_1fb0;
                                      sVar8 = std::
                                              vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              ::size((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)local_23d8);
                                      if (sVar8 != 2) {
                                        HandleRecord::anon_class_1_0_00000001::operator()
                                                  (&local_2432);
                                        local_3c8 = &local_2430;
                                        local_3d0 = &local_2431;
                                        bVar13 = ::fmt::v10::operator()(local_3d0);
                                        local_2428 = (char *)bVar13.size_;
                                        local_2430 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)bVar13.data_;
                                        ::fmt::v10::detail::
                                        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                                  ();
                                        utils::Hex_abi_cxx11_(&local_2458,local_23d8,aBytes_06);
                                        local_6d0 = &local_2420;
                                        local_6e0 = local_2430;
                                        pcStack_6d8 = local_2428;
                                        local_6e8 = &local_2458;
                                        local_6f0 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&entryType.field_2 + 8);
                                        local_20 = &local_6e0;
                                        local_700 = local_2430;
                                        local_6f8 = local_2428;
                                        local_18 = local_700;
                                        pcStack_10 = local_6f8;
                                        ::fmt::v10::
                                        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                                                  (&local_738,(v10 *)local_6e8,local_6f0,local_2430)
                                        ;
                                        local_188 = local_710;
                                        local_190 = &local_738;
                                        local_178 = 0xdd;
                                        fmt_10.size_ = 0xdd;
                                        fmt_10.data_ = local_6f8;
                                        args_10.field_1.values_ = aVar11.values_;
                                        args_10.desc_ = (unsigned_long_long)local_190;
                                        local_180 = local_190;
                                        local_170 = local_188;
                                        local_138 = local_190;
                                        ::fmt::v10::vformat_abi_cxx11_
                                                  (&local_2420,(v10 *)local_700,fmt_10,args_10);
                                        Error::Error(&local_2400,kBadFormat,&local_2420);
                                        Error::operator=(local_b60,&local_2400);
                                        Error::~Error(&local_2400);
                                        std::__cxx11::string::~string((string *)&local_2420);
                                        std::__cxx11::string::~string((string *)&local_2458);
                                        bVar1 = true;
                                        goto LAB_002e32ee;
                                      }
                                      uVar3 = utils::Decode<unsigned_short>((ByteArray *)local_23d8)
                                      ;
                                      *(undefined2 *)((long)&error[8].mCode + 2) = uVar3;
                                      *(uint *)&error[9].mMessage =
                                           *(uint *)&error[9].mMessage | 0x4000;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_002e32e4:
          bVar1 = false;
        }
LAB_002e32ee:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1fb0);
        std::__cxx11::string::~string
                  ((string *)
                   &binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
        if (bVar1) goto joined_r0x002e332d;
        aString = extraout_RDX_00;
      }
    }
    if (*(int *)&error[9].mMessage != 0) {
      tVar9 = time((time_t *)0x0);
      *(time_t *)(error + 9) = tVar9;
      *(uint *)&error[9].mMessage = *(uint *)&error[9].mMessage | 0x20000;
    }
  }
LAB_002e33cb:
  aFrom_local._4_4_ = 0;
LAB_002e33df:
  std::__cxx11::string::~string(local_a40);
  std::__cxx11::string::~string((string *)(entryType.field_2._M_local_buf + 8));
  Address::~Address((Address *)((long)&fromAddrStr.field_2 + 8));
  return aFrom_local._4_4_;
}

Assistant:

int HandleRecord(const struct sockaddr *aFrom,
                 mdns_entry_type_t      aEntry,
                 uint16_t               aType,
                 uint16_t               aRclass,
                 uint32_t               aTtl,
                 const void            *aData,
                 size_t                 aSize,
                 size_t                 aOffset,
                 size_t                 aLength,
                 void                  *aBorderAgent)
{
    struct sockaddr_storage fromAddrStorage;
    Address                 fromAddr;
    std::string             fromAddrStr;
    std::string             entryType;
    char                    nameBuffer[256];

    BorderAgentOrErrorMsg &borderAgentOrErrorMsg = *reinterpret_cast<BorderAgentOrErrorMsg *>(aBorderAgent);
    BorderAgent           &borderAgent           = borderAgentOrErrorMsg.mBorderAgent;
    Error                 &error                 = borderAgentOrErrorMsg.mError;

    (void)aRclass;
    (void)aTtl;

    *reinterpret_cast<struct sockaddr *>(&fromAddrStorage) = *aFrom;
    if (fromAddr.Set(fromAddrStorage) != ErrorCode::kNone)
    {
        ExitNow(error = ERROR_BAD_FORMAT("invalid source address of mDNS response"));
    }

    fromAddrStr = fromAddr.ToString();

    entryType = (aEntry == MDNS_ENTRYTYPE_ANSWER) ? "answer"
                                                  : ((aEntry == MDNS_ENTRYTYPE_AUTHORITY) ? "authority" : "additional");
    if (aType == MDNS_RECORDTYPE_PTR)
    {
        mdns_string_t nameStr = mdns_record_parse_ptr(aData, aSize, aOffset, aLength, nameBuffer, sizeof(nameBuffer));
        borderAgent.mServiceName  = std::string(nameStr.str, nameStr.length);
        borderAgent.mPresentFlags = BorderAgent::kServiceNameBit;
        // TODO(wgtdkp): add debug logging.
    }
    else if (aType == MDNS_RECORDTYPE_SRV)
    {
        mdns_record_srv_t server =
            mdns_record_parse_srv(aData, aSize, aOffset, aLength, nameBuffer, sizeof(nameBuffer));

        borderAgent.mPort = server.port;
        borderAgent.mPresentFlags |= BorderAgent::kPortBit;
    }
    else if (aType == MDNS_RECORDTYPE_A)
    {
        struct sockaddr_storage addrStorage;
        struct sockaddr_in      addr;
        std::string             addrStr;

        mdns_record_parse_a(aData, aSize, aOffset, aLength, &addr);

        *reinterpret_cast<struct sockaddr_in *>(&addrStorage) = addr;
        if (fromAddr.Set(addrStorage) != ErrorCode::kNone)
        {
            ExitNow(error = ERROR_BAD_FORMAT("invalid IPv4 address in A record from {}", fromAddrStr));
        }

        addrStr = fromAddr.ToString();

        // We prefer AAAA (IPv6) address than A (IPv4) address.
        if (!(borderAgent.mPresentFlags & BorderAgent::kAddrBit))
        {
            borderAgent.mAddr = addrStr;
            borderAgent.mPresentFlags |= BorderAgent::kAddrBit;
        }
    }
    else if (aType == MDNS_RECORDTYPE_AAAA)
    {
        struct sockaddr_storage addrStorage;
        struct sockaddr_in6     addr;
        std::string             addrStr;

        mdns_record_parse_aaaa(aData, aSize, aOffset, aLength, &addr);

        *reinterpret_cast<struct sockaddr_in6 *>(&addrStorage) = addr;
        if (fromAddr.Set(addrStorage) != ErrorCode::kNone)
        {
            ExitNow(error = ERROR_BAD_FORMAT("invalid IPv6 address in AAAA record from {}", fromAddrStr));
        }

        addrStr = fromAddr.ToString();

        borderAgent.mAddr = addrStr;
        borderAgent.mPresentFlags |= BorderAgent::kAddrBit;
    }
    else if (aType == MDNS_RECORDTYPE_TXT)
    {
        mdns_record_txt_t txtBuffer[128];
        size_t            parsed;

        parsed = mdns_record_parse_txt(aData, aSize, aOffset, aLength, txtBuffer,
                                       sizeof(txtBuffer) / sizeof(mdns_record_txt_t));

        for (size_t i = 0; i < parsed; ++i)
        {
            auto key         = ToString(txtBuffer[i].key);
            auto value       = ToString(txtBuffer[i].value);
            auto binaryValue = ToByteArray(txtBuffer[i].value);

            if (key == "rv")
            {
                VerifyOrExit(value == "1", error = ERROR_BAD_FORMAT("value of TXT Key 'rv' is {} but not 1 from {}",
                                                                    value, fromAddrStr));
            }
            else if (key == "dd")
            {
                auto &discriminator = binaryValue;

                if (discriminator.size() != kExtendedAddrLength)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'dd' is invalid: value={}",
                                                     utils::Hex(discriminator)));
                }
                else
                {
                    borderAgent.mDiscriminator = discriminator;
                    borderAgent.mPresentFlags |= BorderAgent::kDiscriminatorBit;
                }
            }
            else if (key == "tv")
            {
                borderAgent.mThreadVersion = value;
                borderAgent.mPresentFlags |= BorderAgent::kThreadVersionBit;
            }
            else if (key == "sb")
            {
                auto &bitmap = binaryValue;
                if (bitmap.size() != 4)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'sb' is invalid: value={} from {}",
                                                     utils::Hex(bitmap), fromAddrStr));
                }

                borderAgent.mState.mConnectionMode = (bitmap[3] & 0x07);
                borderAgent.mState.mThreadIfStatus = (bitmap[3] & 0x18) >> 3;
                borderAgent.mState.mAvailability   = (bitmap[3] & 0x60) >> 5;
                borderAgent.mState.mBbrIsActive    = (bitmap[3] & 0x80) >> 7;
                borderAgent.mState.mBbrIsPrimary   = (bitmap[2] & 0x01);
                borderAgent.mPresentFlags |= BorderAgent::kStateBit;
            }
            else if (key == "nn")
            {
                borderAgent.mNetworkName = value;
                borderAgent.mPresentFlags |= BorderAgent::kNetworkNameBit;
            }
            else if (key == "xp")
            {
                auto &extendPanId = binaryValue;
                if (extendPanId.size() != 8)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'xp' is invalid: value={} from {}",
                                                     utils::Hex(extendPanId), fromAddrStr));
                }
                else
                {
                    borderAgent.mExtendedPanId = utils::Decode<uint64_t>(extendPanId);
                    borderAgent.mPresentFlags |= BorderAgent::kExtendedPanIdBit;
                }
            }
            else if (key == "vn")
            {
                borderAgent.mVendorName = value;
                borderAgent.mPresentFlags |= BorderAgent::kVendorNameBit;
            }
            else if (key == "mn")
            {
                borderAgent.mModelName = value;
                borderAgent.mPresentFlags |= BorderAgent::kModelNameBit;
            }
            else if (key == "at")
            {
                auto &activeTimestamp = binaryValue;
                if (activeTimestamp.size() != 8)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'at' is invalid: value={} from {}",
                                                     utils::Hex(activeTimestamp), fromAddrStr));
                }
                else
                {
                    borderAgent.mActiveTimestamp = Timestamp::Decode(utils::Decode<uint64_t>(activeTimestamp));
                    borderAgent.mPresentFlags |= BorderAgent::kActiveTimestampBit;
                }
            }
            else if (key == "pt")
            {
                auto &partitionId = binaryValue;
                if (partitionId.size() != 4)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'pt' is invalid: value={} from {}",
                                                     utils::Hex(partitionId), fromAddrStr));
                }
                else
                {
                    borderAgent.mPartitionId = utils::Decode<uint32_t>(partitionId);
                    borderAgent.mPresentFlags |= BorderAgent::kPartitionIdBit;
                }
            }
            else if (key == "vd")
            {
                borderAgent.mVendorData = value;
                borderAgent.mPresentFlags |= BorderAgent::kVendorDataBit;
            }
            else if (key == "vo")
            {
                auto &oui = binaryValue;
                if (oui.size() != 3)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'vo' is invalid: value={} from {}",
                                                     utils::Hex(oui), fromAddrStr));
                }
                else
                {
                    borderAgent.mVendorOui = oui;
                    borderAgent.mPresentFlags |= BorderAgent::kVendorOuiBit;
                }
            }
            else if (key == "dn")
            {
                borderAgent.mDomainName = value;
                borderAgent.mPresentFlags |= BorderAgent::kDomainNameBit;
            }
            else if (key == "sq")
            {
                auto &bbrSeqNum = binaryValue;
                if (bbrSeqNum.size() != 1)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("[mDNS] value of TXT Key 'sq' is invalid: {} from {}",
                                                     utils::Hex(bbrSeqNum), fromAddrStr));
                }
                else
                {
                    borderAgent.mBbrSeqNumber = utils::Decode<uint8_t>(bbrSeqNum);
                    borderAgent.mPresentFlags |= BorderAgent::kBbrSeqNumberBit;
                }
            }
            else if (key == "bb")
            {
                auto &bbrPort = binaryValue;
                if (bbrPort.size() != 2)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("[mDNS] value of TXT Key 'bb' is invalid: {} from {}",
                                                     utils::Hex(bbrPort), fromAddrStr));
                }
                else
                {
                    borderAgent.mBbrPort = utils::Decode<uint16_t>(bbrPort);
                    borderAgent.mPresentFlags |= BorderAgent::kBbrPortBit;
                }
            }
            else
            {
                // TODO(wgtdkp): add debug logging.
            }
        }
    }
    else
    {
        // TODO(wgtdkp): add debug logging.
    }

    if (borderAgent.mPresentFlags != 0)
    {
        // Actualize Timestamp
        borderAgent.mUpdateTimestamp.mTime = time(nullptr);
        borderAgent.mPresentFlags |= BorderAgent::kUpdateTimestampBit;
    }
exit:
    return 0;
}